

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BestLiteralSelector.hpp
# Opt level: O3

void __thiscall
Kernel::
BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
::doSelection(BestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
              *this,Clause *c,uint eligible)

{
  uint uVar1;
  Literal *l2;
  Comparison CVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Literal *pLVar6;
  Literal *pLVar7;
  
  if (1 < eligible) {
    uVar3 = 1;
    pLVar6 = c->_literals[0];
    uVar4 = 0;
    do {
      l2 = c->_literals[(int)uVar3];
      uVar1 = *(uint *)&(l2->super_Term).field_0xc;
      if (((pLVar6->super_Term).field_0xf & 0x30) == 0) {
        pLVar7 = l2;
        uVar5 = uVar3;
        if ((uVar1 & 0x30000000) == 0) goto LAB_0054d3fc;
      }
      else {
        pLVar7 = pLVar6;
        uVar5 = uVar4;
        if ((uVar1 & 0x30000000) != 0) {
LAB_0054d3fc:
          CVar2 = LiteralComparators::
                  Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>
                  ::compare(&(this->_comp)._c2,pLVar6,l2);
          pLVar7 = l2;
          uVar5 = uVar3;
          if (CVar2 != LESS) {
            pLVar7 = pLVar6;
            uVar5 = uVar4;
          }
        }
      }
      uVar3 = uVar3 + 1;
      pLVar6 = pLVar7;
      uVar4 = uVar5;
    } while (eligible != uVar3);
    if (uVar5 != 0) {
      pLVar6 = c->_literals[0];
      c->_literals[0] = c->_literals[(int)uVar5];
      c->_literals[(int)uVar5] = pLVar6;
    }
  }
  *(ulong *)&c->field_0x38 = *(ulong *)&c->field_0x38 & 0xfff00000ffffffff | 0x100000000;
  Clause::notifyLiteralReorder(c);
  return;
}

Assistant:

void doSelection(Clause* c, unsigned eligible) override
  {
    unsigned besti=0;
    Literal* best=(*c)[0];
    for(unsigned i=1;i<eligible;i++) {
      Literal* lit=(*c)[i];
      if(_comp.compare(best, lit)==LESS) {
        besti=i;
        best=lit;
      }
    }
    if(besti>0) {
      std::swap((*c)[0], (*c)[besti]);
    }
    c->setSelected(1);

#if VDEBUG
    ensureSomeColoredSelected(c, eligible);
    ASS_EQ(c->numSelected(), 1); //if there is colored, it should be selected by the QComparator
#endif
  }